

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dksh.cpp
# Opt level: O0

void __thiscall
context::write_dksh(context *this,size_t code_size,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *output)

{
  program_type pVar1;
  undefined8 this_00;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  program_type *ppVar5;
  size_t sVar6;
  iterator __first;
  iterator __last;
  optional<long> oVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_218;
  const_iterator local_210;
  pointer local_208;
  char *result_bytes;
  array<unsigned_long,_32UL> result;
  dksh_header header;
  dksh_program_header program_header;
  int crs_sz;
  int local_neg_sz;
  int local_pos_sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __sv_type local_40;
  _Storage<long,_true> local_30;
  optional<long> entrypoint_code_offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *output_local;
  size_t code_size_local;
  context *this_local;
  
  entrypoint_code_offset.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = output;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->type);
  if (!bVar2) {
    fatal_error(
               "no type provided, valid are types: vertex, tess_control, tess_eval, geometry, fragment, compute"
               );
  }
  std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
            (&local_60,&this->entrypoint,(char (*) [5])0x14a5be);
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  oVar7 = find_label(this,local_40);
  local_30._M_value =
       oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  entrypoint_code_offset.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  std::__cxx11::string::~string((string *)&local_60);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_30);
  if (bVar2) {
    plVar4 = std::optional<long>::operator*((optional<long> *)&local_30);
    if (*plVar4 % 0x20 != 8) {
      fatal_error("entrypoint is not aligned");
    }
    align8((long)this->local_mem_size);
    header.programs_off = 0;
    header.num_programs = 0;
    ppVar5 = std::optional<context::program_type>::operator*(&this->type);
    header.programs_off = *ppVar5;
    plVar4 = std::optional<long>::operator*((optional<long> *)&local_30);
    header.num_programs = (int)*plVar4 - 8;
    ppVar5 = std::optional<context::program_type>::operator*(&this->type);
    pVar1 = *ppVar5;
    if (pVar1 == vertex) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)&this->second_entrypoint);
      if ((bVar2) || (this->second_num_gprs != 0)) {
        fatal_error("dual vertex shaders are not implemented");
      }
    }
    else if ((pVar1 != fragment) && (pVar1 == compute)) {
      align256((long)this->shared_mem_size);
    }
    result._M_elems[0x1f]._0_4_ = 0x48534b44;
    result._M_elems[0x1f]._4_4_ = 0x18;
    sVar6 = align256(0x58);
    header.magic = (uint32_t)sVar6;
    sVar6 = align256(code_size << 3);
    header.header_sz = (uint32_t)sVar6;
    header.control_sz = 0x18;
    header.code_sz = 1;
    memset(&result_bytes,0,0x100);
    local_208 = std::array<unsigned_long,_32UL>::data((array<unsigned_long,_32UL> *)&result_bytes);
    *local_208 = CONCAT44(result._M_elems[0x1f]._4_4_,(undefined4)result._M_elems[0x1f]);
    local_208[1] = CONCAT44(header.header_sz,header.magic);
    local_208[2] = CONCAT44(header.code_sz,header.control_sz);
    memcpy(local_208 + 3,&header.programs_off,0x40);
    this_00 = entrypoint_code_offset.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._8_8_;
    local_218._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    entrypoint_code_offset.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._8_8_);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_210,&local_218);
    __first = std::array<unsigned_long,_32UL>::begin((array<unsigned_long,_32UL> *)&result_bytes);
    __last = std::array<unsigned_long,_32UL>::end((array<unsigned_long,_32UL> *)&result_bytes);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::insert<unsigned_long*,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,local_210,__first,
               __last);
    return;
  }
  std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_neg_sz,
             &this->entrypoint,(char (*) [5])0x14a5be);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_neg_sz);
  fatal_error("entrypoint \"%s\" not found",pcVar3);
}

Assistant:

void context::write_dksh(size_t code_size, std::vector<uint64_t>& output) const
{
    if (!type) {
        fatal_error(
            "no type provided, "
            "valid are types: vertex, tess_control, tess_eval, geometry, fragment, compute");
    }
    const std::optional entrypoint_code_offset = find_label(entrypoint.value_or("main"));
    if (!entrypoint_code_offset) {
        fatal_error("entrypoint \"%s\" not found", entrypoint.value_or("main").c_str());
    }
    if (*entrypoint_code_offset % 32 != 8) {
        fatal_error("entrypoint is not aligned");
    }

    const int local_pos_sz = align8(local_mem_size);
    const int local_neg_sz = 0;
    const int crs_sz = 0x800;

    dksh_program_header program_header;
    std::memset(&program_header, 0, sizeof(program_header));
    program_header.type = static_cast<uint32_t>(*type);
    program_header.entrypoint = *entrypoint_code_offset - 8;
    program_header.num_gprs = num_gprs;
    program_header.constbuf1_off = 0; // TODO
    program_header.constbuf1_sz = 0;
    program_header.per_warp_scratch_sz = (local_pos_sz + local_neg_sz) * 32 + crs_sz;
    switch (*type) {
    case program_type::vertex:
        if (second_entrypoint || second_num_gprs) {
            fatal_error("dual vertex shaders are not implemented");
        }
        break;
    case program_type::fragment:
        program_header.frag.early_fragment_tests = early_fragment_tests;
        program_header.frag.post_depth_coverage = post_depth_coverage;
        program_header.frag.persample_invocation = persample_invocation;
        break;
    case program_type::compute:
        program_header.comp.block_dims = block_dimensions;
        program_header.comp.shared_mem_sz = align256(shared_mem_size);
        program_header.comp.local_pos_mem_sz = local_pos_sz;
        program_header.comp.local_neg_mem_sz = local_neg_sz;
        program_header.comp.crs_sz = crs_sz;
        program_header.comp.num_barriers = num_barriers;
        break;
    default:
        break;
    }
    static constexpr size_t dksh_size = sizeof(dksh_header) + sizeof(dksh_program_header);
    dksh_header header;
    header.magic = DKSH_MAGIC;
    header.header_sz = sizeof(dksh_header);
    header.control_sz = align256(dksh_size);
    header.code_sz = align256(code_size * sizeof(uint64_t));
    header.programs_off = sizeof(dksh_header);
    header.num_programs = 1;

    std::array<uint64_t, align256(dksh_size) / sizeof(uint64_t)> result{};
    char* const result_bytes = reinterpret_cast<char*>(result.data());
    std::memcpy(result_bytes, &header, sizeof(header));
    std::memcpy(result_bytes + sizeof(header), &program_header, sizeof(program_header));
    output.insert(output.end(), result.begin(), result.end());
}